

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_resize.cpp
# Opt level: O0

void checkWindowSize(GLFWwindow *window,int width,int height,bool fatal)

{
  ostream *poVar1;
  char *pcVar2;
  int local_24;
  int local_20;
  int h;
  int w;
  int iStack_14;
  bool fatal_local;
  int height_local;
  int width_local;
  GLFWwindow *window_local;
  
  h._3_1_ = fatal;
  w = height;
  iStack_14 = width;
  _height_local = window;
  glfwGetWindowSize(window,&local_20,&local_24);
  if ((local_20 != iStack_14) || (local_24 != w)) {
    pcVar2 = "warning";
    if ((h._3_1_ & 1) != 0) {
      pcVar2 = "error";
    }
    poVar1 = std::operator<<((ostream *)&std::cerr,pcVar2);
    poVar1 = std::operator<<(poVar1,": ");
    poVar1 = std::operator<<(poVar1,"expected window size ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iStack_14);
    poVar1 = std::operator<<(poVar1,"x");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,w);
    poVar1 = std::operator<<(poVar1,", but got ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_20);
    poVar1 = std::operator<<(poVar1,"x");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_24);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    if ((h._3_1_ & 1) != 0) {
      exit(1);
    }
  }
  return;
}

Assistant:

static void
checkWindowSize(GLFWwindow* window, int width, int height, bool fatal)
{
    int w, h;
    glfwGetWindowSize(window, &w, &h);
    if (w == width && h == height) {
        return;
    }
    std::cerr << (fatal ? "error" : "warning") << ": "
              << "expected window size " << width << "x" << height
              << ", but got " << w << "x" << h << std::endl;
    if (fatal) {
        exit(EXIT_FAILURE);
    }
}